

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_light.cpp
# Opt level: O3

Vector2D __thiscall
CGL::SceneObjects::EnvironmentLight::dir_to_theta_phi(EnvironmentLight *this,Vector3D *dir)

{
  double dVar1;
  double dVar2;
  undefined1 (*in_RDX) [16];
  _func_int **pp_Var3;
  undefined1 auVar4 [16];
  double dVar5;
  Vector2D VVar6;
  
  auVar4 = vdppd_avx(*in_RDX,*in_RDX,0x31);
  dVar5 = *(double *)in_RDX[1] * *(double *)in_RDX[1] + auVar4._0_8_;
  if (dVar5 < 0.0) {
    dVar5 = sqrt(dVar5);
  }
  else {
    auVar4._8_8_ = 0;
    auVar4._0_8_ = dVar5;
    auVar4 = vsqrtsd_avx(auVar4,auVar4);
    dVar5 = auVar4._0_8_;
  }
  dVar5 = 1.0 / dVar5;
  dVar1 = *(double *)*in_RDX;
  dVar2 = *(double *)in_RDX[1];
  pp_Var3 = (_func_int **)acos(dVar5 * *(double *)(*in_RDX + 8));
  dVar5 = atan2(-dVar5 * dVar2,dVar5 * dVar1);
  (this->super_SceneLight)._vptr_SceneLight = pp_Var3;
  this->envMap = (HDRImageBuffer *)(dVar5 + 3.141592653589793);
  VVar6.y = (double)pp_Var3;
  VVar6.x = dVar5 + 3.141592653589793;
  return VVar6;
}

Assistant:

Vector2D EnvironmentLight::dir_to_theta_phi(const Vector3D dir) const {
    Vector3D unit_dir = dir.unit();
    double theta = acos(unit_dir.y);
    double phi = atan2(-unit_dir.z, unit_dir.x) + PI;
    return Vector2D(theta, phi);
  }